

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::operator*=(Function *this,Function *add)

{
  Function *this_00;
  EVP_PKEY_CTX *in_RDX;
  Function *ctx;
  Function *clone;
  Function *add_local;
  Function *this_local;
  
  if (this->eType == EMPTY) {
    copy(this,(EVP_PKEY_CTX *)add,in_RDX);
  }
  else {
    this_00 = (Function *)operator_new(400);
    ctx = this;
    Function(this_00,this);
    init(this,(EVP_PKEY_CTX *)ctx);
    this->xLeft = this_00;
    this->xRight = add;
    setType(this,TIMES);
  }
  return;
}

Assistant:

void Function::operator*=( Function &add )
{
	if (eType==EMPTY)
		copy(add);
	else {
		Function *clone = new Function(*this);
		init();
		xLeft = clone;
		xRight = &add;
		setType(TIMES);
	}
}